

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

float Lf_CutSwitches(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = 0.0;
  for (uVar1 = 0; uVar1 < (byte)pCut->field_0x17; uVar1 = uVar1 + 1) {
    fVar3 = Vec_FltEntry(&p->vSwitches,*(int *)((long)&pCut[1].Sign + uVar1 * 4));
    fVar2 = fVar2 + fVar3;
  }
  return fVar2;
}

Assistant:

static inline float Lf_CutSwitches( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    float Switches = 0; int i; 
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        Switches += Lf_ObjSwitches(p, pCut->pLeaves[i]);
//printf( "%.2f ", Switches );
    return Switches;
}